

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gzclose_r(gzFile file)

{
  int iVar1;
  gz_statep state;
  int ret;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -2;
  }
  else if (*file == 0x1c4f) {
    if (*(int *)((long)file + 0x18) != 0) {
      inflateEnd((z_streamp)((long)file + 0x78));
      free(*(void **)((long)file + 0x28));
      free(*(void **)((long)file + 0x20));
    }
    gz_error((gz_statep)file,0,(char *)0x0);
    free(*(void **)((long)file + 8));
    iVar1 = close(*(int *)((long)file + 4));
    free(file);
    file_local._4_4_ = 0;
    if (iVar1 != 0) {
      file_local._4_4_ = -1;
    }
  }
  else {
    file_local._4_4_ = -2;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzclose_r(gzFile file)
{
    int ret;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    /* check that we're reading */
    if (state->mode != GZ_READ)
        return Z_STREAM_ERROR;

    /* free memory and close file */
    if (state->size) {
        inflateEnd(&(state->strm));
        free(state->out);
        free(state->in);
    }
    gz_error(state, Z_OK, NULL);
    free(state->path);
    ret = close(state->fd);
    free(state);
    return ret ? Z_ERRNO : Z_OK;
}